

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-font.c
# Opt level: O1

float plutovg_font_face_traverse_glyph_path
                (plutovg_font_face_t *face,float size,float x,float y,plutovg_codepoint_t codepoint,
                plutovg_path_traverse_func_t traverse_func,void *closure)

{
  ushort uVar1;
  stbtt_vertex *psVar2;
  glyph_t *pgVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  plutovg_path_command_t pVar7;
  plutovg_point_t points [3];
  plutovg_matrix_t matrix;
  float local_90;
  float local_8c;
  plutovg_point_t local_88;
  float local_80;
  float local_7c;
  float local_78;
  float local_74;
  void *local_68;
  plutovg_matrix_t local_60;
  float local_48;
  
  uVar1 = *(ushort *)((face->info).data + (long)(face->info).head + 0x12);
  local_48 = size / (float)(ushort)(uVar1 << 8 | uVar1 >> 8);
  local_68 = closure;
  plutovg_matrix_init_translate(&local_60,x,y);
  plutovg_matrix_scale(&local_60,local_48,-local_48);
  pgVar3 = plutovg_font_face_get_glyph(face,codepoint);
  if (0 < pgVar3->nvertices) {
    local_8c = 0.0;
    lVar6 = 0;
    lVar5 = 0;
    local_90 = 0.0;
    do {
      psVar2 = pgVar3->vertices;
      switch((&psVar2->type)[lVar6]) {
      case '\x01':
        local_8c = (float)(int)*(short *)((long)&psVar2->x + lVar6);
        local_90 = (float)(int)*(short *)((long)&psVar2->y + lVar6);
        local_88.x = local_8c;
        local_88.y = local_90;
        plutovg_matrix_map_points(&local_60,&local_88,&local_88,1);
        pVar7 = PLUTOVG_PATH_COMMAND_MOVE_TO;
        break;
      case '\x02':
        local_8c = (float)(int)*(short *)((long)&psVar2->x + lVar6);
        local_90 = (float)(int)*(short *)((long)&psVar2->y + lVar6);
        local_88.x = local_8c;
        local_88.y = local_90;
        plutovg_matrix_map_points(&local_60,&local_88,&local_88,1);
        pVar7 = PLUTOVG_PATH_COMMAND_LINE_TO;
        break;
      case '\x03':
        local_80 = (float)(int)*(short *)((long)&psVar2->cx + lVar6) * 0.6666667;
        local_88.x = local_8c * 0.33333334 + local_80;
        local_88.y = (float)(int)*(short *)((long)&psVar2->cy + lVar6) * 0.6666667 +
                     local_90 * 0.33333334;
        local_78 = (float)(int)*(short *)((long)&psVar2->x + lVar6);
        local_80 = local_78 * 0.33333334 + local_80;
        local_7c = (float)(int)*(short *)((long)&psVar2->cy + lVar6) * 0.6666667 +
                   (float)(int)*(short *)((long)&psVar2->y + lVar6) * 0.33333334;
        goto LAB_0012583a;
      case '\x04':
        local_88.x = (float)(int)*(short *)((long)&psVar2->cx + lVar6);
        local_88.y = (float)(int)*(short *)((long)&psVar2->cy + lVar6);
        local_80 = (float)(int)*(short *)((long)&psVar2->cx1 + lVar6);
        local_7c = (float)(int)*(short *)((long)&psVar2->cy1 + lVar6);
        local_78 = (float)(int)*(short *)((long)&psVar2->x + lVar6);
LAB_0012583a:
        local_8c = local_78;
        local_90 = (float)(int)*(short *)((long)&psVar2->y + lVar6);
        local_74 = local_90;
        plutovg_matrix_map_points(&local_60,&local_88,&local_88,3);
        pVar7 = PLUTOVG_PATH_COMMAND_CUBIC_TO;
        iVar4 = 3;
        goto LAB_001258d1;
      default:
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]lunasvg/plutovg/source/plutovg-font.c"
                      ,0x166,
                      "float plutovg_font_face_traverse_glyph_path(plutovg_font_face_t *, float, float, float, plutovg_codepoint_t, plutovg_path_traverse_func_t, void *)"
                     );
      }
      iVar4 = 1;
LAB_001258d1:
      (*traverse_func)(local_68,pVar7,&local_88,iVar4);
      lVar5 = lVar5 + 1;
      lVar6 = lVar6 + 0xe;
    } while (lVar5 < pgVar3->nvertices);
  }
  return local_48 * (float)pgVar3->advance_width;
}

Assistant:

float plutovg_font_face_traverse_glyph_path(plutovg_font_face_t* face, float size, float x, float y, plutovg_codepoint_t codepoint, plutovg_path_traverse_func_t traverse_func, void* closure)
{
    float scale = plutovg_font_face_get_scale(face, size);
    plutovg_matrix_t matrix;
    plutovg_matrix_init_translate(&matrix, x, y);
    plutovg_matrix_scale(&matrix, scale, -scale);

    plutovg_point_t points[3];
    plutovg_point_t current_point = {0, 0};
    glyph_t* glyph = plutovg_font_face_get_glyph(face, codepoint);
    for(int i = 0; i < glyph->nvertices; i++) {
        switch(glyph->vertices[i].type) {
        case STBTT_vmove:
            points[0].x = glyph->vertices[i].x;
            points[0].y = glyph->vertices[i].y;
            current_point = points[0];
            plutovg_matrix_map_points(&matrix, points, points, 1);
            traverse_func(closure, PLUTOVG_PATH_COMMAND_MOVE_TO, points, 1);
            break;
        case STBTT_vline:
            points[0].x = glyph->vertices[i].x;
            points[0].y = glyph->vertices[i].y;
            current_point = points[0];
            plutovg_matrix_map_points(&matrix, points, points, 1);
            traverse_func(closure, PLUTOVG_PATH_COMMAND_LINE_TO, points, 1);
            break;
        case STBTT_vcurve:
            points[0].x = 2.f / 3.f * glyph->vertices[i].cx + 1.f / 3.f * current_point.x;
            points[0].y = 2.f / 3.f * glyph->vertices[i].cy + 1.f / 3.f * current_point.y;
            points[1].x = 2.f / 3.f * glyph->vertices[i].cx + 1.f / 3.f * glyph->vertices[i].x;
            points[1].y = 2.f / 3.f * glyph->vertices[i].cy + 1.f / 3.f * glyph->vertices[i].y;
            points[2].x = glyph->vertices[i].x;
            points[2].y = glyph->vertices[i].y;
            current_point = points[2];
            plutovg_matrix_map_points(&matrix, points, points, 3);
            traverse_func(closure, PLUTOVG_PATH_COMMAND_CUBIC_TO, points, 3);
            break;
        case STBTT_vcubic:
            points[0].x = glyph->vertices[i].cx;
            points[0].y = glyph->vertices[i].cy;
            points[1].x = glyph->vertices[i].cx1;
            points[1].y = glyph->vertices[i].cy1;
            points[2].x = glyph->vertices[i].x;
            points[2].y = glyph->vertices[i].y;
            current_point = points[2];
            plutovg_matrix_map_points(&matrix, points, points, 3);
            traverse_func(closure, PLUTOVG_PATH_COMMAND_CUBIC_TO, points, 3);
            break;
        default:
            assert(false);
        }
    }

    return glyph->advance_width * scale;
}